

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  float size;
  ImFont *this;
  char *pcVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  float fVar3;
  ImVec2 IVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (((int)CONCAT71(in_register_00000011,hide_text_after_double_hash) != 0) &&
     (pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end), text_end = text,
     pcVar1 = text, text < pcVar2)) {
    do {
      text_end = pcVar1;
      if (*pcVar1 == '#') {
        if (pcVar1[1] == '#') break;
      }
      else if (*pcVar1 == '\0') break;
      pcVar1 = pcVar1 + 1;
      text_end = pcVar2;
    } while (pcVar1 != pcVar2);
  }
  size = GImGui->FontSize;
  if (text_end == text) {
    IVar4 = (ImVec2)((ulong)(uint)size << 0x20);
  }
  else {
    this = GImGui->Font;
    auVar5._0_8_ = ImFont::CalcTextSizeA
                             (this,size,3.4028235e+38,wrap_width,text,text_end,(char **)0x0);
    auVar5._8_8_ = extraout_XMM0_Qb;
    fVar3 = auVar5._0_4_;
    if (0.0 < fVar3) {
      auVar5._0_4_ = fVar3 - size / this->FontSize;
    }
    auVar6._4_12_ = auVar5._4_12_;
    auVar6._0_4_ = (float)(int)(auVar5._0_4_ + 0.95);
    IVar4 = auVar6._0_8_;
  }
  return IVar4;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Cancel out character spacing for the last character of a line (it is baked into glyph->XAdvance field)
    const float font_scale = font_size / font->FontSize;
    const float character_spacing_x = 1.0f * font_scale;
    if (text_size.x > 0.0f)
        text_size.x -= character_spacing_x;
    text_size.x = (float)(int)(text_size.x + 0.95f);

    return text_size;
}